

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-pending-on-close.c
# Opt level: O2

int run_test_signal_pending_on_close(void)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b_3;
  int64_t eval_b_6;
  int pipefds [2];
  int64_t eval_a;
  size_t local_10;
  
  local_10 = eval_a;
  iVar1 = uv_loop_init(&::loop);
  eval_a = (int64_t)(long)iVar1;
  pipefds[0] = 0;
  pipefds[1] = 0;
  if ((char *)(long)iVar1 == (char *)0x0) {
    iVar1 = uv_signal_init(&::loop,&signal_hdl);
    eval_a = (int64_t)(long)iVar1;
    pipefds[0] = 0;
    pipefds[1] = 0;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar2 = "uv_signal_init(&loop, &signal_hdl)";
      uVar6 = 0x43;
      goto LAB_0016f096;
    }
    iVar1 = uv_signal_start(&signal_hdl,signal_cb,0xd);
    eval_a = (int64_t)(long)iVar1;
    pipefds[0] = 0;
    pipefds[1] = 0;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar2 = "uv_signal_start(&signal_hdl, signal_cb, 13)";
      uVar6 = 0x45;
      goto LAB_0016f096;
    }
    iVar1 = pipe(pipefds);
    eval_a = (int64_t)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar2 = "pipe(pipefds)";
      uVar6 = 0x47;
      goto LAB_0016f13a;
    }
    iVar1 = uv_pipe_init(&::loop,&pipe_hdl,0);
    eval_a = (int64_t)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar2 = "uv_pipe_init(&loop, &pipe_hdl, 0)";
      uVar6 = 0x49;
      goto LAB_0016f13a;
    }
    iVar1 = uv_pipe_open(&pipe_hdl,pipefds[1]);
    eval_a = (int64_t)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar2 = "uv_pipe_open(&pipe_hdl, pipefds[1])";
      uVar6 = 0x4b;
      goto LAB_0016f13a;
    }
    pcVar2 = (char *)malloc(0x1000000);
    buf = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar3 = "!=";
      pcVar5 = "!=";
      eval_b_6 = 0;
      eval_b_3 = 0;
      pcVar4 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar2 = "buf";
      uVar6 = 0x4f;
      goto LAB_0016f269;
    }
    memset(pcVar2,0x2e,0x1000000);
    _eval_a = uv_buf_init(pcVar2,0x1000000);
    iVar1 = uv_write(&write_req,(uv_stream_t *)&pipe_hdl,(uv_buf_t *)&eval_a,1,write_cb);
    eval_b_3 = (int64_t)iVar1;
    eval_b_6 = 0;
    if (eval_b_3 == 0) {
      close(pipefds[0]);
      loop = &::loop;
      iVar1 = uv_run(&::loop,UV_RUN_DEFAULT);
      eval_b_3 = (int64_t)iVar1;
      eval_b_6 = 0;
      if (eval_b_3 == 0) {
        eval_b_3 = 2;
        eval_b_6 = (int64_t)close_cb_called;
        if (eval_b_6 == 2) {
          close_loop(loop);
          eval_b_3 = 0;
          iVar1 = uv_loop_close(&::loop);
          eval_b_6 = (int64_t)iVar1;
          if (eval_b_6 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(&loop)";
          pcVar2 = "0";
          uVar6 = 0x5d;
        }
        else {
          pcVar4 = "close_cb_called";
          pcVar2 = "2";
          uVar6 = 0x5b;
        }
      }
      else {
        pcVar4 = "0";
        pcVar2 = "uv_run(&loop, UV_RUN_DEFAULT)";
        uVar6 = 0x59;
      }
    }
    else {
      pcVar4 = "0";
      pcVar2 = "r";
      uVar6 = 0x54;
    }
  }
  else {
    pcVar2 = "uv_loop_init(&loop)";
    uVar6 = 0x41;
LAB_0016f096:
    pipefds[0] = 0;
    pipefds[1] = 0;
LAB_0016f13a:
    eval_b_6 = 0;
    pcVar4 = "0";
    eval_b_3 = eval_a;
  }
  pcVar5 = "==";
  pcVar3 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0016f269:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal-pending-on-close.c"
          ,uVar6,pcVar2,pcVar3,pcVar4,eval_b_3,pcVar5,eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(signal_pending_on_close) {
  int pipefds[2];
  uv_buf_t buffer;
  int r;

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_signal_init(&loop, &signal_hdl));

  ASSERT_OK(uv_signal_start(&signal_hdl, signal_cb, SIGPIPE));

  ASSERT_OK(pipe(pipefds));

  ASSERT_OK(uv_pipe_init(&loop, &pipe_hdl, 0));

  ASSERT_OK(uv_pipe_open(&pipe_hdl, pipefds[1]));

  /* Write data large enough so it needs loop iteration */
  buf = malloc(1<<24);
  ASSERT_NOT_NULL(buf);
  memset(buf, '.', 1<<24);
  buffer = uv_buf_init(buf, 1<<24);

  r = uv_write(&write_req, (uv_stream_t *) &pipe_hdl, &buffer, 1, write_cb);
  ASSERT_OK(r);

  /* cause a SIGPIPE on write in next iteration */
  close(pipefds[0]);

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}